

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

char * sanitize_cookie_path(char *cookie_path)

{
  char *local_28;
  char *new_path;
  size_t len;
  char *cookie_path_local;
  
  len = (size_t)cookie_path;
  local_28 = (*Curl_cstrdup)(cookie_path);
  if (local_28 == (char *)0x0) {
    cookie_path_local = (char *)0x0;
  }
  else {
    new_path = (char *)strlen(local_28);
    if (*local_28 == '\"') {
      memmove(local_28,local_28 + 1,(size_t)new_path);
      new_path = new_path + -1;
    }
    if ((new_path != (char *)0x0) && (local_28[(long)(new_path + -1)] == '\"')) {
      local_28[(long)(new_path + -1)] = '\0';
      new_path = new_path + -1;
    }
    if (*local_28 == '/') {
      if ((new_path != (char *)0x0) && (local_28[(long)(new_path + -1)] == '/')) {
        local_28[(long)(new_path + -1)] = '\0';
      }
      cookie_path_local = local_28;
    }
    else {
      strstore(&local_28,"/");
      cookie_path_local = local_28;
    }
  }
  return cookie_path_local;
}

Assistant:

static char *sanitize_cookie_path(const char *cookie_path)
{
  size_t len;
  char *new_path = strdup(cookie_path);
  if(!new_path)
    return NULL;

  /* some stupid site sends path attribute with '"'. */
  len = strlen(new_path);
  if(new_path[0] == '\"') {
    memmove((void *)new_path, (const void *)(new_path + 1), len);
    len--;
  }
  if(len && (new_path[len - 1] == '\"')) {
    new_path[len - 1] = 0x0;
    len--;
  }

  /* RFC6265 5.2.4 The Path Attribute */
  if(new_path[0] != '/') {
    /* Let cookie-path be the default-path. */
    strstore(&new_path, "/");
    return new_path;
  }

  /* convert /hoge/ to /hoge */
  if(len && new_path[len - 1] == '/') {
    new_path[len - 1] = 0x0;
  }

  return new_path;
}